

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_table.c
# Opt level: O3

aom_codec_err_t
aom_film_grain_table_write
          (aom_film_grain_table_t *t,char *filename,aom_internal_error_info *error_info)

{
  int iVar1;
  aom_film_grain_table_entry_t *paVar2;
  uint uVar3;
  FILE *__s;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  aom_film_grain_t *pars;
  int i;
  long lVar7;
  
  error_info->error_code = AOM_CODEC_OK;
  __s = fopen64(filename,"wb");
  if (__s == (FILE *)0x0) {
    aom_internal_error(error_info,AOM_CODEC_ERROR,"Unable to open file %s",filename);
  }
  else {
    sVar4 = fwrite("filmgrn1",8,1,__s);
    if (sVar4 == 0) {
      aom_internal_error(error_info,AOM_CODEC_ERROR,"Unable to write file magic");
      fclose(__s);
    }
    else {
      fputc(10,__s);
      for (paVar2 = t->head; paVar2 != (aom_film_grain_table_entry_t *)0x0; paVar2 = paVar2->next) {
        fprintf(__s,"E %ld %ld %d %d %d\n",paVar2->start_time,paVar2->end_time,
                (ulong)(uint)(paVar2->params).apply_grain,(ulong)(paVar2->params).random_seed,
                (ulong)(uint)(paVar2->params).update_parameters);
        if ((paVar2->params).update_parameters != 0) {
          fprintf(__s,"\tp %d %d %d %d %d %d %d %d %d %d %d %d\n",
                  (ulong)(uint)(paVar2->params).ar_coeff_lag,
                  (ulong)(uint)(paVar2->params).ar_coeff_shift,
                  (ulong)(uint)(paVar2->params).grain_scale_shift,
                  (ulong)(uint)(paVar2->params).scaling_shift,
                  (ulong)(uint)(paVar2->params).chroma_scaling_from_luma,
                  (ulong)(uint)(paVar2->params).overlap_flag,(ulong)(uint)(paVar2->params).cb_mult,
                  (ulong)(uint)(paVar2->params).cb_luma_mult,(ulong)(uint)(paVar2->params).cb_offset
                  ,(ulong)(uint)(paVar2->params).cr_mult,(ulong)(uint)(paVar2->params).cr_luma_mult,
                  (ulong)(uint)(paVar2->params).cr_offset);
          fprintf(__s,"\tsY %d ",(ulong)(uint)(paVar2->params).num_y_points);
          if (0 < (paVar2->params).num_y_points) {
            lVar5 = 0;
            do {
              fprintf(__s," %d %d",(ulong)(uint)(paVar2->params).scaling_points_y[lVar5][0],
                      (ulong)(uint)(paVar2->params).scaling_points_y[lVar5][1]);
              lVar5 = lVar5 + 1;
            } while (lVar5 < (paVar2->params).num_y_points);
          }
          fprintf(__s,"\n\tsCb %d",(ulong)(uint)(paVar2->params).num_cb_points);
          if (0 < (paVar2->params).num_cb_points) {
            lVar5 = 0;
            do {
              fprintf(__s," %d %d",(ulong)(uint)(paVar2->params).scaling_points_cb[lVar5][0],
                      (ulong)(uint)(paVar2->params).scaling_points_cb[lVar5][1]);
              lVar5 = lVar5 + 1;
            } while (lVar5 < (paVar2->params).num_cb_points);
          }
          fprintf(__s,"\n\tsCr %d",(ulong)(uint)(paVar2->params).num_cr_points);
          if (0 < (paVar2->params).num_cr_points) {
            lVar5 = 0;
            do {
              fprintf(__s," %d %d",(ulong)(uint)(paVar2->params).scaling_points_cr[lVar5][0],
                      (ulong)(uint)(paVar2->params).scaling_points_cr[lVar5][1]);
              lVar5 = lVar5 + 1;
            } while (lVar5 < (paVar2->params).num_cr_points);
          }
          fwrite("\n\tcY",4,1,__s);
          iVar1 = (paVar2->params).ar_coeff_lag;
          uVar3 = (iVar1 + 1) * iVar1 * 2;
          if (0 < (int)uVar3) {
            uVar6 = 0;
            do {
              fprintf(__s," %d",(ulong)(uint)(paVar2->params).ar_coeffs_y[uVar6]);
              uVar6 = uVar6 + 1;
            } while (uVar3 != uVar6);
          }
          fwrite("\n\tcCb",5,1,__s);
          if ((int)uVar3 < 0) {
            fwrite("\n\tcCr",5,1,__s);
          }
          else {
            lVar5 = (ulong)uVar3 + 1;
            lVar7 = 0;
            do {
              fprintf(__s," %d",(ulong)(uint)(paVar2->params).ar_coeffs_cb[lVar7]);
              lVar7 = lVar7 + 1;
            } while (lVar5 != lVar7);
            fwrite("\n\tcCr",5,1,__s);
            lVar7 = 0;
            do {
              fprintf(__s," %d",(ulong)(uint)(paVar2->params).ar_coeffs_cr[lVar7]);
              lVar7 = lVar7 + 1;
            } while (lVar5 != lVar7);
          }
          fputc(10,__s);
        }
      }
      fclose(__s);
    }
  }
  return error_info->error_code;
}

Assistant:

aom_codec_err_t aom_film_grain_table_write(
    const aom_film_grain_table_t *t, const char *filename,
    struct aom_internal_error_info *error_info) {
  error_info->error_code = AOM_CODEC_OK;

  FILE *file = fopen(filename, "wb");
  if (!file) {
    aom_internal_error(error_info, AOM_CODEC_ERROR, "Unable to open file %s",
                       filename);
    return error_info->error_code;
  }

  if (!fwrite(kFileMagic, 8, 1, file)) {
    aom_internal_error(error_info, AOM_CODEC_ERROR,
                       "Unable to write file magic");
    fclose(file);
    return error_info->error_code;
  }

  fprintf(file, "\n");
  aom_film_grain_table_entry_t *entry = t->head;
  while (entry) {
    grain_table_entry_write(file, entry);
    entry = entry->next;
  }
  fclose(file);
  return error_info->error_code;
}